

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tree_element_image_push_hashed_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,int title_len,
              nk_collapse_states *state,int *selected)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_vec2 nVar3;
  nk_vec2 nVar4;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect r;
  nk_rect rect;
  nk_rect r_00;
  int iVar5;
  nk_command_buffer *b;
  nk_style *pnVar6;
  float fVar7;
  float local_11c;
  float local_118;
  float local_114;
  nk_context *local_110;
  nk_context *local_108;
  nk_rect label;
  nk_flags dummy;
  nk_style_item *background;
  nk_widget_layout_states widget_state;
  nk_flags ws;
  nk_text text;
  nk_rect sym;
  nk_rect header;
  nk_vec2 item_spacing;
  float text_width;
  int text_len;
  nk_vec2 padding;
  float row_height;
  nk_symbol_type symbol;
  nk_style_button *button;
  nk_input *in;
  nk_command_buffer *out;
  nk_style *style;
  nk_panel *layout;
  nk_window *win;
  nk_collapse_states *state_local;
  int title_len_local;
  char *title_local;
  nk_image *img_local;
  nk_tree_type type_local;
  nk_context *ctx_local;
  
  memset(&sym.w,0,0x10);
  memset(&text.background,0,0x10);
  background._4_4_ = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x47da,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        ctx_local._4_4_ = 0;
      }
      else {
        pnVar1 = ctx->current;
        pnVar2 = pnVar1->layout;
        b = &pnVar1->buffer;
        pnVar6 = &ctx->style;
        nVar3 = (ctx->style).window.spacing;
        nVar4 = (ctx->style).selectable.padding;
        fVar7 = (ctx->style).tab.padding.y;
        fVar7 = fVar7 + fVar7 + pnVar6->font->height;
        nk_layout_set_min_row_height(ctx,fVar7);
        nk_layout_row_dynamic(ctx,fVar7,1);
        nk_layout_reset_min_row_height(ctx);
        background._0_4_ = nk_widget((nk_rect *)&sym.w,ctx);
        if (type == NK_TREE_TAB) {
          if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
            r.y = sym.h;
            r.x = sym.w;
            r.w = header.x;
            r.h = header.y;
            nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
            text.padding.x = (float)nk_rgba(0,0,0,0);
          }
          else {
            text.padding.x = *(float *)&(ctx->style).tab.background.data.color;
            rect.y = sym.h;
            rect.x = sym.w;
            rect.w = header.x;
            rect.h = header.y;
            nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
            r_00.y = sym.h;
            r_00.x = sym.w;
            r_00.w = header.x;
            r_00.h = header.y;
            join_0x00001240_0x00001200_ = nk_shrink_rect(r_00,(ctx->style).tab.border);
            nk_fill_rect(b,join_0x00001240_0x00001200_,(ctx->style).tab.rounding,
                         (ctx->style).tab.background.data.color);
          }
        }
        else {
          text.padding.x = *(float *)&(ctx->style).window.background;
        }
        local_108 = ctx;
        if ((pnVar2->flags & 0x1000) != 0) {
          local_108 = (nk_context *)0x0;
        }
        if ((local_108 == (nk_context *)0x0) ||
           (local_110 = ctx, (nk_widget_layout_states)background != NK_WIDGET_VALID)) {
          local_110 = (nk_context *)0x0;
        }
        if (*state == NK_MAXIMIZED) {
          padding.y = (float)(ctx->style).tab.sym_maximize;
          if (type == NK_TREE_TAB) {
            _row_height = &(ctx->style).tab.tab_maximize_button;
          }
          else {
            _row_height = &(ctx->style).tab.node_maximize_button;
          }
        }
        else {
          padding.y = (float)(ctx->style).tab.sym_minimize;
          if (type == NK_TREE_TAB) {
            _row_height = &(ctx->style).tab.tab_minimize_button;
          }
          else {
            _row_height = &(ctx->style).tab.node_minimize_button;
          }
        }
        sym.x = pnVar6->font->height;
        text.text = (nk_color)(sym.h + (ctx->style).tab.padding.y);
        text.background = (nk_color)(sym.w + (ctx->style).tab.padding.x);
        bounds_01.y = (float)text.text;
        bounds_01.x = (float)text.background;
        bounds_01.w = sym.x;
        bounds_01.h = sym.x;
        sym.y = sym.x;
        iVar5 = nk_do_button_symbol((nk_flags *)((long)&background + 4),&pnVar1->buffer,bounds_01,
                                    (nk_symbol_type)padding.y,NK_BUTTON_DEFAULT,_row_height,
                                    &local_110->input,pnVar6->font);
        if (iVar5 != 0) {
          *state = (uint)(*state != NK_MAXIMIZED);
        }
        label.w = 0.0;
        iVar5 = nk_strlen(title);
        local_118 = (*pnVar6->font->width)(pnVar6->font->userdata,pnVar6->font->height,title,iVar5);
        text_width = nVar4.x;
        local_118 = text_width * 4.0 + local_118;
        header.w = nVar3.x;
        if (sym.x + header.w <= header.x) {
          local_114 = header.x;
        }
        else {
          local_114 = sym.x + header.w;
        }
        fVar7 = (float)text.background + sym.x + header.w;
        header.h = nVar3.y;
        if (local_114 - (sym.x + header.h + (ctx->style).tab.indent) < local_118) {
          local_118 = local_114 - (sym.x + header.h + (ctx->style).tab.indent);
        }
        label.x = local_118;
        label.y = pnVar6->font->height;
        if (img == (nk_image *)0x0) {
          bounds_00.y = (float)text.text;
          bounds_00.x = fVar7;
          bounds_00.w = local_118;
          bounds_00.h = label.y;
          nk_do_selectable((nk_flags *)&label.w,&pnVar1->buffer,bounds_00,title,title_len,0x11,
                           selected,&(ctx->style).selectable,&local_110->input,pnVar6->font);
        }
        else {
          bounds.y = (float)text.text;
          bounds.x = fVar7;
          bounds.w = local_118;
          bounds.h = label.y;
          nk_do_selectable_image
                    ((nk_flags *)&label.w,&pnVar1->buffer,bounds,title,title_len,0x11,selected,img,
                     &(ctx->style).selectable,&local_110->input,pnVar6->font);
        }
        if (*state == NK_MAXIMIZED) {
          pnVar2->at_x = sym.w + (float)*pnVar2->offset_x + (ctx->style).tab.indent;
          if ((ctx->style).tab.indent <= (pnVar2->bounds).w) {
            local_11c = (pnVar2->bounds).w;
          }
          else {
            local_11c = (ctx->style).tab.indent;
          }
          (pnVar2->bounds).w = local_11c;
          (pnVar2->bounds).w =
               (pnVar2->bounds).w - ((ctx->style).tab.indent + (ctx->style).window.padding.x);
          (pnVar2->row).tree_depth = (pnVar2->row).tree_depth + 1;
          ctx_local._4_4_ = 1;
        }
        else {
          ctx_local._4_4_ = 0;
        }
      }
      return ctx_local._4_4_;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x47dc,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x47db,
                "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
               );
}

Assistant:

NK_INTERN int
nk_tree_element_image_push_hashed_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, int title_len,
    enum nk_collapse_states *state, int *selected)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;
    const struct nk_input *in;
    const struct nk_style_button *button;
    enum nk_symbol_type symbol;
    float row_height;
    struct nk_vec2 padding;

    int text_len;
    float text_width;

    struct nk_vec2 item_spacing;
    struct nk_rect header = {0,0,0,0};
    struct nk_rect sym = {0,0,0,0};
    struct nk_text text;

    nk_flags ws = 0;
    enum nk_widget_layout_states widget_state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* cache some data */
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    padding = style->selectable.padding;

    /* calculate header bounds and draw background */
    row_height = style->font->height + 2 * style->tab.padding.y;
    nk_layout_set_min_row_height(ctx, row_height);
    nk_layout_row_dynamic(ctx, row_height, 1);
    nk_layout_reset_min_row_height(ctx);

    widget_state = nk_widget(&header, ctx);
    if (type == NK_TREE_TAB) {
        const struct nk_style_item *background = &style->tab.background;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            nk_draw_image(out, header, &background->data.image, nk_white);
            text.background = nk_rgba(0,0,0,0);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, style->tab.border_color);
            nk_fill_rect(out, nk_shrink_rect(header, style->tab.border),
                style->tab.rounding, background->data.color);
        }
    } else text.background = style->window.background;

    in = (!(layout->flags & NK_WINDOW_ROM)) ? &ctx->input: 0;
    in = (in && widget_state == NK_WIDGET_VALID) ? &ctx->input : 0;

    /* select correct button style */
    if (*state == NK_MAXIMIZED) {
        symbol = style->tab.sym_maximize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_maximize_button;
        else button = &style->tab.node_maximize_button;
    } else {
        symbol = style->tab.sym_minimize;
        if (type == NK_TREE_TAB)
            button = &style->tab.tab_minimize_button;
        else button = &style->tab.node_minimize_button;
    }
    {/* draw triangle button */
    sym.w = sym.h = style->font->height;
    sym.y = header.y + style->tab.padding.y;
    sym.x = header.x + style->tab.padding.x;
    if (nk_do_button_symbol(&ws, &win->buffer, sym, symbol, NK_BUTTON_DEFAULT, button, in, style->font))
        *state = (*state == NK_MAXIMIZED) ? NK_MINIMIZED : NK_MAXIMIZED;}

    /* draw label */
    {nk_flags dummy = 0;
    struct nk_rect label;
    /* calculate size of the text and tooltip */
    text_len = nk_strlen(title);
    text_width = style->font->width(style->font->userdata, style->font->height, title, text_len);
    text_width += (4 * padding.x);

    header.w = NK_MAX(header.w, sym.w + item_spacing.x);
    label.x = sym.x + sym.w + item_spacing.x;
    label.y = sym.y;
    label.w = NK_MIN(header.w - (sym.w + item_spacing.y + style->tab.indent), text_width);
    label.h = style->font->height;

    if (img) {
        nk_do_selectable_image(&dummy, &win->buffer, label, title, title_len, NK_TEXT_LEFT,
            selected, img, &style->selectable, in, style->font);
    } else nk_do_selectable(&dummy, &win->buffer, label, title, title_len, NK_TEXT_LEFT,
            selected, &style->selectable, in, style->font);
    }
    /* increase x-axis cursor widget position pointer */
    if (*state == NK_MAXIMIZED) {
        layout->at_x = header.x + (float)*layout->offset_x + style->tab.indent;
        layout->bounds.w = NK_MAX(layout->bounds.w, style->tab.indent);
        layout->bounds.w -= (style->tab.indent + style->window.padding.x);
        layout->row.tree_depth++;
        return nk_true;
    } else return nk_false;
}